

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::TestMessageEnum::_InternalSerialize
          (TestMessageEnum *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  const_reference piVar3;
  byte *pbVar4;
  uint8_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  int index;
  
  iVar2 = google::protobuf::internal::SooRep::size
                    ((SooRep *)&(this->field_0)._impl_,
                     (undefined1  [24])((undefined1  [24])this->field_0 & (undefined1  [24])0x4) ==
                     (undefined1  [24])0x0);
  if (0 < iVar2) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar3 = google::protobuf::RepeatedField<int>::Get
                         (&(this->field_0)._impl_.redactable_enum_,index);
      uVar6 = (ulong)*piVar3;
      pbVar4 = target + 1;
      *target = 8;
      uVar7 = uVar6;
      if (0x7f < uVar6) {
        do {
          *pbVar4 = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          pbVar4 = pbVar4 + 1;
          bVar1 = 0x3fff < uVar7;
          uVar7 = uVar6;
        } while (bVar1);
      }
      *pbVar4 = (byte)uVar6;
      target = pbVar4 + 1;
      index = index + 1;
    } while (index != iVar2);
  }
  uVar7 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar7 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar7 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar5;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMessageEnum::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMessageEnum& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestMessageEnum)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated .proto2_unittest.MetaAnnotatedEnum redactable_enum = 1;
  for (int i = 0, n = this_._internal_redactable_enum_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, static_cast<::proto2_unittest::MetaAnnotatedEnum>(this_._internal_redactable_enum().Get(i)),
        target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestMessageEnum)
  return target;
}